

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O0

void __thiscall
sync_tests::potential_deadlock_detected::test_method(potential_deadlock_detected *this)

{
  long lVar1;
  long in_FS_OFFSET;
  Mutex mutex2;
  Mutex mutex1;
  RecursiveMutex rmutex2;
  RecursiveMutex rmutex1;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff18;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffd0;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffd8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffe0;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  ::(anonymous_namespace)::TestPotentialDeadLockDetected<AnnotatedMixin<std::recursive_mutex>>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  ::(anonymous_namespace)::TestPotentialDeadLockDetected<AnnotatedMixin<std::recursive_mutex>>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  AnnotatedMixin<std::mutex>::AnnotatedMixin(in_stack_ffffffffffffff18);
  AnnotatedMixin<std::mutex>::AnnotatedMixin(in_stack_ffffffffffffff18);
  ::(anonymous_namespace)::TestPotentialDeadLockDetected<AnnotatedMixin<std::mutex>>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  ::(anonymous_namespace)::TestPotentialDeadLockDetected<AnnotatedMixin<std::mutex>>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(in_stack_ffffffffffffff18);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(in_stack_ffffffffffffff18);
  AnnotatedMixin<std::recursive_mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  AnnotatedMixin<std::recursive_mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(potential_deadlock_detected)
{
    #ifdef DEBUG_LOCKORDER
    bool prev = g_debug_lockorder_abort;
    g_debug_lockorder_abort = false;
    #endif

    RecursiveMutex rmutex1, rmutex2;
    TestPotentialDeadLockDetected(rmutex1, rmutex2);
    // The second test ensures that lock tracking data have not been broken by exception.
    TestPotentialDeadLockDetected(rmutex1, rmutex2);

    Mutex mutex1, mutex2;
    TestPotentialDeadLockDetected(mutex1, mutex2);
    // The second test ensures that lock tracking data have not been broken by exception.
    TestPotentialDeadLockDetected(mutex1, mutex2);

    #ifdef DEBUG_LOCKORDER
    g_debug_lockorder_abort = prev;
    #endif
}